

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::get_unit(string *unit_string,uint64_t match_flags)

{
  char cVar1;
  undefined4 uVar2;
  long *plVar3;
  precise_unit pVar4;
  precise_unit pVar5;
  precise_unit pVar6;
  bool bVar7;
  int iVar8;
  unit_data uVar9;
  uint uVar10;
  iterator iVar11;
  size_t sVar12;
  precise_unit *ppVar13;
  const_iterator cVar14;
  long lVar15;
  __hash_code __code;
  ulong uVar16;
  long *plVar17;
  long *plVar18;
  undefined8 unaff_R14;
  double extraout_XMM0_Qa;
  double dVar19;
  precise_unit pVar20;
  precise_unit actUnit;
  size_t index;
  char *ptr;
  size_t local_28;
  char *local_20;
  
  if (((_ZN5unitsL21allowUserDefinedUnitsE_0 & 1) != 0) &&
     (user_defined_units_abi_cxx11_._24_8_ != 0)) {
    iVar11 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)user_defined_units_abi_cxx11_,unit_string);
    dVar19 = extraout_XMM0_Qa;
    if (iVar11.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
        ._M_cur != (__node_type *)0x0) {
      dVar19 = *(double *)
                ((long)iVar11.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                       ._M_cur + 0x28);
      unaff_R14 = *(undefined8 *)
                   ((long)iVar11.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                          ._M_cur + 0x30);
    }
    pVar4.base_units_ = (unit_data)(int)unaff_R14;
    pVar4.commodity_ = (int)((ulong)unaff_R14 >> 0x20);
    pVar4.multiplier_ = dVar19;
    if (iVar11.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
        ._M_cur != (__node_type *)0x0) {
      return pVar4;
    }
  }
  uVar16 = match_flags & 0xff;
  if ((match_flags & 0xff) == 0) {
    uVar16 = unitsDomain;
  }
  if (uVar16 != 0) {
    sVar12 = std::
             hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_28,unit_string);
    uVar16 = sVar12 ^ uVar16;
    plVar17 = *(long **)(domainSpecificUnit + (uVar16 % _DAT_001a6be8) * 8);
    plVar18 = (long *)0x0;
    if ((plVar17 != (long *)0x0) &&
       (plVar3 = (long *)*plVar17, plVar18 = plVar17, uVar16 != ((long *)*plVar17)[1])) {
      while (plVar17 = plVar3, plVar3 = (long *)*plVar17, plVar3 != (long *)0x0) {
        plVar18 = (long *)0x0;
        if (((ulong)plVar3[1] % _DAT_001a6be8 != uVar16 % _DAT_001a6be8) ||
           (plVar18 = plVar17, uVar16 == plVar3[1])) goto LAB_0015fb5a;
      }
      plVar18 = (long *)0x0;
    }
LAB_0015fb5a:
    if (plVar18 == (long *)0x0) {
      lVar15 = 0;
    }
    else {
      lVar15 = *plVar18;
    }
    ppVar13 = (precise_unit *)&precise::invalid;
    if (lVar15 != 0) {
      ppVar13 = (precise_unit *)(lVar15 + 0x10);
    }
    uVar2 = ppVar13->base_units_;
    if (uVar2 != -0x56b5b78 || !NAN(ppVar13->multiplier_)) {
      return *ppVar13;
    }
  }
  cVar14 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)base_unit_vals_abi_cxx11_,unit_string);
  if (cVar14.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(precise_unit *)
            ((long)cVar14.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                   ._M_cur + 0x28);
  }
  cVar1 = *(unit_string->_M_dataplus)._M_p;
  pVar6.base_units_ = (unit_data)0xfa94a488;
  pVar6.commodity_ = 0;
  pVar6.multiplier_ = NAN;
  pVar5.base_units_ = (unit_data)0xfa94a488;
  pVar5.commodity_ = 0;
  pVar5.multiplier_ = NAN;
  if ((cVar1 != 'E') && (cVar1 != 'C')) {
    return pVar5;
  }
  if (unit_string->_M_string_length < 6) {
    return pVar6;
  }
  local_28 = 0;
  iVar8 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x5);
  if ((iVar8 != 0) || (bVar7 = hasAdditionalOps(unit_string), bVar7)) {
LAB_0015fc46:
    iVar8 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x6);
    if ((iVar8 == 0) && (bVar7 = hasAdditionalOps(unit_string), !bVar7)) {
      local_20 = (char *)0x0;
      lVar15 = strtol((unit_string->_M_dataplus)._M_p + 6,&local_20,0);
      if (*local_20 == ']') {
        uVar10 = (((uint)lVar15 & 7) << 0x18 | 0xc00) << 4 | 0x50000;
        uVar10 = (uVar10 >> 2 & 0x10013000) + (uVar10 & 0x30010000) * 4;
        uVar9 = (unit_data)
                ((uVar10 >> 1 & 0x40001000) + (uVar10 & 0x50051000) * 2 >> 1 |
                (int)((uint)lVar15 << 0x1c) >> 0x11 & 0xc000U);
        goto LAB_0015fce2;
      }
    }
    iVar8 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x6);
    if ((iVar8 == 0) && (bVar7 = hasAdditionalOps(unit_string), !bVar7)) {
      local_20 = (char *)0x0;
      lVar15 = strtol((unit_string->_M_dataplus)._M_p + 6,&local_20,0);
      if (*local_20 == ']') {
        uVar10 = (uint)lVar15;
        uVar16 = (ulong)((uVar10 & 1) << 0x1e | (uVar10 & 0x10) << 0x11 | (uVar10 & 8) << 0x17 |
                         (uVar10 & 4) << 0x1a | (uVar10 & 2) << 0x1c) | 0x80000000;
        goto LAB_0015fd8d;
      }
    }
    pVar20.base_units_ = (unit_data)0xfa94a488;
    pVar20.commodity_ = 0;
    pVar20.multiplier_ = NAN;
  }
  else {
    local_20 = (char *)0x0;
    lVar15 = strtol((unit_string->_M_dataplus)._M_p + 5,&local_20,0);
    if (*local_20 != ']') goto LAB_0015fc46;
    uVar9 = precise::custom::custom_unit((uint16_t)lVar15);
LAB_0015fce2:
    uVar16 = (ulong)(uint)uVar9;
LAB_0015fd8d:
    actUnit.base_units_ = (unit_data)(int)uVar16;
    actUnit.commodity_ = (int)(uVar16 >> 0x20);
    actUnit.multiplier_ = 1.0;
    pVar20 = commoditizedUnit(unit_string,actUnit,&local_28);
  }
  return pVar20;
}

Assistant:

static precise_unit
    get_unit(const std::string& unit_string, std::uint64_t match_flags)
{
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        if (!user_defined_units.empty()) {
            auto fnd2 = user_defined_units.find(unit_string);
            if (fnd2 != user_defined_units.end()) {
                return fnd2->second;
            }
        }
    }

    auto cdomain = getCurrentDomain(match_flags);
    if (cdomain != domains::defaultDomain) {
        auto dmunit = getDomainUnit(cdomain, unit_string);
        if (is_valid(dmunit)) {
            return dmunit;
        }
    }

    auto fnd = base_unit_vals.find(unit_string);
    if (fnd != base_unit_vals.end()) {
        return fnd->second;
    }
    // empty string would have been found already
    auto c = unit_string.front();
    if ((c == 'C' || c == 'E') && unit_string.size() >= 6) {
        size_t index{0};
        if (unit_string.compare(0, 5, "CXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 5, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string, precise::generate_custom_unit(num), index);
                }
            }
        }
        if (unit_string.compare(0, 6, "CXCUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise::generate_custom_count_unit(num),
                        index);
                }
            }
        }
        if (unit_string.compare(0, 6, "EQXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise_unit(precise::custom::equation_unit(num)),
                        index);
                }
            }
        }
    }
    return precise::invalid;
}